

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_FindNumbers(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  uint Nums [1024];
  
  puVar4 = Nums;
  srand(0x6f);
  for (lVar2 = 0; lVar2 != 0x1000; lVar2 = lVar2 + 1) {
    iVar1 = rand();
    *(char *)((long)Nums + lVar2) = (char)iVar1;
  }
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    printf("    ");
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      printf("0x%08x,",(ulong)*(uint *)((long)puVar4 + lVar3 * 4));
    }
    putchar(10);
    puVar4 = (uint *)((long)puVar4 + 0x20);
  }
  return;
}

Assistant:

void Iso_FindNumbers()
{
    unsigned Nums[1024];
    unsigned char * pNums = (unsigned char *)Nums;
    int i, j;
    srand( 111 );
    for ( i = 0; i < 1024 * 4; i++ )
        pNums[i] = (unsigned char)rand();
    // write out
    for ( i = 0; i < 128; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 8; j++ )
            printf( "0x%08x,", Nums[i*8+j] );
        printf( "\n" );
    }
}